

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O1

void amrex::MLLinOp::Finalize(void)

{
  (anonymous_namespace)::initialized = 0;
  return;
}

Assistant:

void MLLinOp::Finalize ()
{
    initialized = false;
#ifdef BL_USE_MPI
    comm_cache.reset();
#endif
#ifdef AMREX_SOFT_PERF_COUNTERS
    MLCellLinOp::perf_counters.reset();
#endif
}